

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::MessageLite::MergeFromImpl
          (MessageLite *this,CodedInputStream *input,ParseFlags parse_flags)

{
  EpsCopyInputStream *this_00;
  bool bVar1;
  uint uVar2;
  _func_int **pp_Var3;
  TcParseTableBase *pTVar4;
  ulong uVar5;
  ParseContext ctx;
  ZeroCopyCodedInputStream zcis;
  MessageLite local_c0 [2];
  MessageLite *in_stack_ffffffffffffff60;
  TcParseTableBase *table;
  ZeroCopyInputStream local_40;
  CodedInputStream *local_38;
  
  local_40._vptr_ZeroCopyInputStream = (_func_int **)&PTR__ZeroCopyInputStream_004567f8;
  this_00 = (EpsCopyInputStream *)(local_c0 + 1);
  table = (TcParseTableBase *)0x0;
  local_38 = input;
  pp_Var3 = (_func_int **)internal::EpsCopyInputStream::InitFrom(this_00,&local_40);
  pTVar4 = GetTcParseTable(this);
  local_c0[0]._vptr_MessageLite = pp_Var3;
  do {
    bVar1 = internal::EpsCopyInputStream::DoneWithCheck<false>(this_00,(char **)local_c0,0);
    if (bVar1) break;
    uVar2 = (uint)pTVar4->fast_idx_mask & (uint)*(ushort *)local_c0[0]._vptr_MessageLite;
    if ((uVar2 & 7) != 0) goto LAB_00243961;
    uVar5 = (ulong)(uVar2 & 0xfffffff8);
    local_c0[0]._vptr_MessageLite =
         (_func_int **)
         (**(code **)(&pTVar4[1].has_bits_offset + uVar5))
                   (this,local_c0[0]._vptr_MessageLite,this_00,
                    (ulong)*(ushort *)local_c0[0]._vptr_MessageLite ^
                    *(ulong *)(&pTVar4[1].fast_idx_mask + uVar5 * 2),pTVar4,0);
  } while (local_c0[0]._vptr_MessageLite != (_func_int **)0x0);
  if ((pTVar4->field_0x9 & 1) == 0) {
    pp_Var3 = local_c0[0]._vptr_MessageLite;
    if (local_c0[0]._vptr_MessageLite != (_func_int **)0x0) goto LAB_002438ae;
    internal::TcParser::VerifyHasBitConsistency(in_stack_ffffffffffffff60,table);
    pp_Var3 = local_c0[0]._vptr_MessageLite;
  }
  else {
    pp_Var3 = (_func_int **)
              (*pTVar4->post_loop_handler)
                        (this,(char *)local_c0[0]._vptr_MessageLite,(ParseContext *)(local_c0 + 1));
  }
  if (pp_Var3 == (_func_int **)0x0) {
    return false;
  }
LAB_002438ae:
  internal::EpsCopyInputStream::BackUp((EpsCopyInputStream *)(local_c0 + 1),(char *)pp_Var3);
  MergeFromImpl(local_c0);
LAB_00243961:
  internal::protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x452);
}

Assistant:

bool MessageLite::MergeFromImpl(io::CodedInputStream* input,
                                MessageLite::ParseFlags parse_flags) {
  ZeroCopyCodedInputStream zcis(input);
  const char* ptr;
  internal::ParseContext ctx(input->RecursionBudget(), zcis.aliasing_enabled(),
                             &ptr, &zcis);
  // MergePartialFromCodedStream allows terminating the wireformat by 0 or
  // end-group tag. Leaving it up to the caller to verify correct ending by
  // calling LastTagWas on input. We need to maintain this behavior.
  ctx.TrackCorrectEnding();
  ctx.data().pool = input->GetExtensionPool();
  ctx.data().factory = input->GetExtensionFactory();
  ptr = internal::TcParser::ParseLoop(this, ptr, &ctx, GetTcParseTable());
  if (ABSL_PREDICT_FALSE(!ptr)) return false;
  ctx.BackUp(ptr);
  if (!ctx.EndedAtEndOfStream()) {
    ABSL_DCHECK_NE(ctx.LastTag(), 1u);  // We can't end on a pushed limit.
    if (ctx.IsExceedingLimit(ptr)) return false;
    input->SetLastTag(ctx.LastTag());
  } else {
    input->SetConsumed();
  }
  return CheckFieldPresence(ctx, *this, parse_flags);
}